

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O3

uint __thiscall
MovParsedSRTTrackData::newBufferSize(MovParsedSRTTrackData *this,uint8_t *buff,uint size)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  uint uVar3;
  int64_t iVar4;
  ushort *puVar5;
  ushort uVar6;
  ushort *puVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  ushort *puVar11;
  long lVar12;
  string prefix;
  string local_90;
  undefined1 *local_70;
  undefined8 local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  int local_4c;
  int64_t local_48;
  int64_t iStack_40;
  
  local_48 = this->sttsPos;
  iStack_40 = this->sttsCnt;
  local_70 = &local_60;
  local_68 = 0;
  local_60 = 0;
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_70,0,(char *)0x0,0x20a1f5);
  }
  lVar9 = this->m_timeOffset;
  iVar4 = getSttsVal(this);
  lVar12 = iVar4 + lVar9;
  if (size < 3) {
    this->m_timeOffset = lVar12;
    uVar8 = 0;
  }
  else {
    local_4c = this->m_packetCnt + 1;
    int32ToStr_abi_cxx11_(&local_90,&local_4c);
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    paVar1 = &local_90.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    floatToTime_abi_cxx11_(&local_90,(double)lVar9 / 1000.0,',');
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::append((char *)&local_70);
    floatToTime_abi_cxx11_(&local_90,(double)lVar12 / 1000.0,',');
    std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_90._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::push_back((char)&local_70);
    puVar5 = (ushort *)(buff + size);
    do {
      uVar6 = *(ushort *)buff << 8 | *(ushort *)buff >> 8;
      buff = (uint8_t *)((long)buff + 2);
    } while (uVar6 == 0);
    uVar8 = (uint)uVar6;
    puVar11 = (ushort *)((long)buff + (ulong)uVar6);
    while (puVar11 < puVar5) {
      puVar7 = puVar11 + 4;
      lVar9 = ((ulong)(byte)puVar11[1] << 8 |
              (long)(int)((uint)(byte)*puVar11 << 0x18) |
              (ulong)*(byte *)((long)puVar11 + 1) << 0x10) + (ulong)*(byte *)((long)puVar11 + 3) +
              -8;
      if (lVar9 == 1) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          uVar10 = (ulong)*(byte *)((long)puVar7 + lVar9) | uVar10 << 8;
          lVar9 = lVar9 + 1;
        } while ((int)lVar9 != 8);
        puVar7 = puVar11 + 8;
        lVar9 = uVar10 - 8;
      }
      uVar2 = *(uint *)(puVar11 + 2);
      if ((uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18) ==
          0x7374796c) {
        uVar6 = *puVar7 << 8 | *puVar7 >> 8;
        puVar11 = puVar7 + 1;
        if (uVar6 != 0) {
          uVar10 = (ulong)uVar6;
          do {
            if ((ushort)(*puVar11 << 8 | *puVar11 >> 8) <
                (ushort)(puVar11[1] << 8 | puVar11[1] >> 8)) {
              uVar6 = puVar11[3];
              uVar2 = uVar8 + 7;
              if ((uVar6 & 1) == 0) {
                uVar2 = uVar8;
              }
              uVar3 = uVar2 + 7;
              if ((uVar6 & 2) == 0) {
                uVar3 = uVar2;
              }
              uVar8 = uVar3 + 7;
              if ((uVar6 & 4) == 0) {
                uVar8 = uVar3;
              }
            }
            puVar11 = puVar11 + 6;
            uVar10 = uVar10 - 1;
          } while (uVar10 != 0);
        }
      }
      else {
        puVar11 = (ushort *)((long)puVar7 + lVar9);
      }
    }
    this->sttsPos = local_48;
    this->sttsCnt = iStack_40;
    uVar8 = uVar8 + (int)local_68 + 2;
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return uVar8;
}

Assistant:

unsigned newBufferSize(uint8_t* buff, const unsigned size) override
    {
        const int64_t stored_sttsCnt = sttsCnt;
        const int64_t stored_sttsPos = sttsPos;
        const uint8_t* end = buff + size;
        std::string prefix;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        const int64_t startTime = m_timeOffset;
        const int64_t endTime = startTime + getSttsVal();
        if (size <= 2)
        {
            m_timeOffset = endTime;
            return 0;
        }
        prefix += int32ToStr(m_packetCnt + 1);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        int textLen = 0, unitSize = 0;

        try
        {
            while (unitSize == 0)
            {
                unitSize = (buff[0] << 8) | buff[1];
                buff += 2;
            }
            textLen = unitSize;
            buff += unitSize;

            while (buff < end)
            {
                int64_t modifierLen = buff[0] << 24 | buff[1] << 16 | buff[2] << 8 | buff[3];
                const uint32_t modifierType = buff[4] << 24 | buff[5] << 16 | buff[6] << 8 | buff[7];
                buff += 8;
                modifierLen -= 8;
                if (modifierLen == 1)  // 64-bit length
                {
                    modifierLen = 0;
                    for (int i = 0; i < 8; i++)
                    {
                        modifierLen <<= 8;
                        modifierLen |= *buff++;
                    }
                    modifierLen -= 8;
                }
                if (modifierType == 0x7374796C)  // 'styl' box
                {
                    const auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    buff += 2;
                    for (size_t i = 0; i < entry_count; i++)
                    {
                        const auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                        const auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                        buff += 6;                // startChar, endChar, font-ID
                        if (startChar < endChar)  // face style flags
                        {
                            if (*buff & 1)  // bold
                                textLen += 7;
                            if (*buff & 2)  // italics
                                textLen += 7;
                            if (*buff & 4)  // underline
                                textLen += 7;
                        }
                        buff += 6;  // font-size, text-color-rgba[4]
                    }
                }
                else
                    buff += modifierLen;
            }
        }
        catch (BitStreamException& e)
        {
            (void)e;
            LTRACE(LT_ERROR, 2, "MP4/MOV error: Invalid SRT frame at position " << m_demuxer->getProcessedBytes());
        }

        sttsCnt = stored_sttsCnt;
        sttsPos = stored_sttsPos;
        return static_cast<int>(prefix.length() + textLen + 2);
    }